

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::BasicComputeTest::initPrograms
          (BasicComputeTest *this,SourceCollections *programCollection)

{
  ProgramSources *pPVar1;
  long *local_90;
  long local_88;
  long local_80 [2];
  string local_70;
  uint local_50;
  value_type local_48;
  
  TestCase::initPrograms((TestCase *)this,programCollection);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"basic_compute","");
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_70);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "#version 310 es\nlayout(local_size_x = 128) in;\nlayout(std430) buffer;\nlayout(binding = 0) readonly buffer Input0\n{\n  vec4 elements[];\n} input_data0;\nlayout(binding = 1) writeonly buffer Output\n{\n  vec4 elements[];\n} output_data;\nvoid main()\n{\n  uint ident = gl_GlobalInvocationID.x;\n  output_data.elements[ident] = input_data0.elements[ident] * input_data0.elements[ident];\n}"
             ,"");
  local_50 = 5;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_90,local_88 + (long)local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar1->sources + local_50,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BasicComputeTest::initPrograms(SourceCollections& programCollection) const
{
	TimestampTest::initPrograms(programCollection);

	programCollection.glslSources.add("basic_compute") << glu::ComputeSource(
		"#version 310 es\n"
		"layout(local_size_x = 128) in;\n"
		"layout(std430) buffer;\n"
		"layout(binding = 0) readonly buffer Input0\n"
		"{\n"
		"  vec4 elements[];\n"
		"} input_data0;\n"
		"layout(binding = 1) writeonly buffer Output\n"
		"{\n"
		"  vec4 elements[];\n"
		"} output_data;\n"
		"void main()\n"
		"{\n"
		"  uint ident = gl_GlobalInvocationID.x;\n"
		"  output_data.elements[ident] = input_data0.elements[ident] * input_data0.elements[ident];\n"
		"}");
}